

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_store_statement
          (CompilerMSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  size_type sVar1;
  bool bVar2;
  uint32_t uVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  SPIRType *pSVar6;
  char *in_R8;
  char (*in_R9) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3a0;
  byte local_bea;
  bool local_ba9;
  byte local_b99;
  undefined1 local_b98 [8];
  string rhs_1;
  string lhs_1;
  string local_b38 [32];
  string local_b18;
  undefined1 local_af8 [8];
  string rhs;
  string lhs;
  undefined1 local_a92;
  spirv_cross local_a91;
  string local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  ulong local_a50;
  size_type end_dot_index;
  size_type end_column_index;
  size_type column_index_1;
  string lhs_expr_1;
  undefined1 local_a10 [4];
  uint32_t c_1;
  SPIRType write_type_1;
  string local_890;
  uint local_86c;
  undefined1 local_868 [4];
  uint32_t i_3;
  string local_848;
  undefined1 local_828 [8];
  string unpacked_expr;
  undefined1 local_800 [4];
  uint32_t j_1;
  undefined1 local_7e0 [8];
  string rhs_row_1;
  undefined1 local_7b8 [4];
  uint32_t i_2;
  SPIRType vector_type_1;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  BaseType local_5b4;
  undefined1 local_5b0 [4];
  uint32_t j;
  undefined1 local_590 [8];
  string rhs_row;
  undefined1 local_568 [4];
  uint32_t i_1;
  SPIRType vector_type;
  string local_3e8;
  uint local_3c4;
  string local_3c0 [4];
  uint32_t i;
  string local_3a0;
  undefined1 local_380 [8];
  string cast_expr;
  SPIRType write_type;
  char *pcStack_1f8;
  bool rhs_transpose;
  char *packed_pfx;
  SPIRVariable *local_1d0;
  SPIRVariable *p_var_lhs;
  undefined1 local_1c0 [8];
  string cast_addr_space;
  SPIRType *physical_type;
  undefined1 local_190 [4];
  TypeID physical_type_id;
  undefined1 local_16a;
  spirv_cross local_169;
  string local_168;
  string *local_148;
  size_type column_index;
  string lhs_expr;
  undefined1 local_118 [4];
  uint32_t c;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_88;
  string local_68;
  ID local_44;
  ID local_40;
  byte local_39;
  SPIRExpression *pSStack_38;
  bool transpose;
  SPIRExpression *rhs_e;
  SPIRExpression *lhs_e;
  bool lhs_packed_type;
  SPIRType *pSStack_20;
  bool lhs_remapped_type;
  SPIRType *type;
  uint32_t rhs_expression_local;
  uint32_t lhs_expression_local;
  CompilerMSL *this_local;
  
  type._0_4_ = rhs_expression;
  type._4_4_ = lhs_expression;
  _rhs_expression_local = this;
  pSStack_20 = Compiler::expression_type((Compiler *)this,rhs_expression);
  lhs_e._7_1_ = Compiler::has_extended_decoration
                          ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypeID);
  lhs_e._6_1_ = Compiler::has_extended_decoration
                          ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
  rhs_e = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,type._4_4_);
  pSStack_38 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,(uint32_t)type);
  local_b99 = 0;
  if (rhs_e != (SPIRExpression *)0x0) {
    local_b99 = rhs_e->need_transpose;
  }
  local_39 = local_b99 & 1;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_40,type._4_4_);
  bVar2 = Compiler::has_decoration((Compiler *)this,local_40,BuiltIn);
  local_ba9 = false;
  if (bVar2) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_44,type._4_4_);
    uVar3 = Compiler::get_decoration((Compiler *)this,local_44,BuiltIn);
    local_ba9 = false;
    if (uVar3 == 0x14) {
      local_ba9 = Compiler::is_array((Compiler *)this,pSStack_20);
    }
  }
  if (local_ba9 == false) {
    if (((lhs_e._7_1_ & 1) == 0) && ((lhs_e._6_1_ & 1) == 0)) {
      bVar2 = Compiler::is_matrix((Compiler *)this,pSStack_20);
      if (((bVar2) && (rhs_e != (SPIRExpression *)0x0)) && ((rhs_e->need_transpose & 1U) != 0)) {
        rhs_e->need_transpose = false;
        if ((pSStack_38 == (SPIRExpression *)0x0) || ((pSStack_38->need_transpose & 1U) == 0)) {
          CompilerGLSL::to_expression_abi_cxx11_
                    (&local_f8,&this->super_CompilerGLSL,type._4_4_,true);
          CompilerGLSL::to_unpacked_expression_abi_cxx11_
                    ((string *)local_118,&this->super_CompilerGLSL,(uint32_t)type,true);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[3]>
                    (&this->super_CompilerGLSL,&local_f8,(char (*) [14])" = transpose(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     (char (*) [3])0x5b6d88);
          ::std::__cxx11::string::~string((string *)local_118);
          ::std::__cxx11::string::~string((string *)&local_f8);
        }
        else {
          pSStack_38->need_transpose = false;
          CompilerGLSL::to_expression_abi_cxx11_
                    (&local_b8,&this->super_CompilerGLSL,type._4_4_,true);
          CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                    (&local_d8,&this->super_CompilerGLSL,(uint32_t)type);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,&local_b8,(char (*) [4])0x5abcd8,&local_d8,
                     (char (*) [2])0x5abb6c);
          ::std::__cxx11::string::~string((string *)&local_d8);
          ::std::__cxx11::string::~string((string *)&local_b8);
          pSStack_38->need_transpose = true;
        }
        rhs_e->need_transpose = true;
        Compiler::register_write((Compiler *)this,type._4_4_);
      }
      else if ((rhs_e == (SPIRExpression *)0x0) || ((rhs_e->need_transpose & 1U) == 0)) {
        CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,type._4_4_,(uint32_t)type);
      }
      else {
        rhs_e->need_transpose = false;
        for (lhs_expr.field_2._12_4_ = 0; (uint)lhs_expr.field_2._12_4_ < pSStack_20->vecsize;
            lhs_expr.field_2._12_4_ = lhs_expr.field_2._12_4_ + 1) {
          CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                    ((string *)&column_index,&this->super_CompilerGLSL,type._4_4_,true);
          psVar4 = (string *)::std::__cxx11::string::find_last_of((char)&column_index,0x5b);
          local_148 = psVar4;
          if (psVar4 != (string *)0xffffffffffffffff) {
            local_169 = (spirv_cross)0x5b;
            local_16a = 0x5d;
            join<char,unsigned_int&,char>
                      (&local_168,&local_169,lhs_expr.field_2._M_local_buf + 0xc,(uint *)&local_16a,
                       in_R8);
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ::std::__cxx11::string::insert((ulong)&column_index,psVar4);
            CompilerGLSL::to_extract_component_expression_abi_cxx11_
                      ((string *)local_190,&this->super_CompilerGLSL,(uint32_t)type,
                       lhs_expr.field_2._12_4_);
            in_R8 = ";";
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,pbVar5,(char (*) [4])0x5abcd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_190,(char (*) [2])0x5abb6c);
            ::std::__cxx11::string::~string((string *)local_190);
            ::std::__cxx11::string::~string((string *)&local_168);
          }
          ::std::__cxx11::string::~string((string *)&column_index);
        }
        rhs_e->need_transpose = true;
        Compiler::register_write((Compiler *)this,type._4_4_);
      }
    }
    else if (((lhs_e._7_1_ & 1) != 0) ||
            ((bVar2 = Compiler::is_matrix((Compiler *)this,pSStack_20), bVar2 ||
             ((local_39 & 1) != 0)))) {
      if ((lhs_e._7_1_ & 1) == 0) {
        physical_type._0_4_ = (pSStack_20->super_IVariant).self.id;
      }
      else {
        uVar3 = Compiler::get_extended_decoration
                          ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypeID);
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&physical_type,uVar3);
      }
      physical_type._4_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&physical_type);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&physical_type + 4));
      cast_addr_space.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)local_1c0,"thread",(allocator *)((long)&p_var_lhs + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&p_var_lhs + 7));
      local_1d0 = Compiler::maybe_get_backing_variable((Compiler *)this,type._4_4_);
      if (local_1d0 != (SPIRVariable *)0x0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_1d0->super_IVariant).field_0xc);
        pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
        get_type_address_space_abi_cxx11_((string *)&packed_pfx,this,pSVar6,type._4_4_,false);
        ::std::__cxx11::string::operator=((string *)local_1c0,(string *)&packed_pfx);
        ::std::__cxx11::string::~string((string *)&packed_pfx);
      }
      bVar2 = Compiler::is_matrix((Compiler *)this,pSStack_20);
      if (bVar2) {
        pcStack_1f8 = "";
        if ((lhs_e._6_1_ & 1) != 0) {
          pcStack_1f8 = "packed_";
        }
        local_bea = 0;
        if (pSStack_38 != (SPIRExpression *)0x0) {
          local_bea = pSStack_38->need_transpose;
        }
        local_bea = local_bea & 1;
        SPIRType::SPIRType((SPIRType *)((long)&cast_expr.field_2 + 8),pSStack_20);
        ::std::__cxx11::string::string((string *)local_380);
        if (local_bea != 0) {
          pSStack_38->need_transpose = false;
        }
        if ((local_39 & 1) == 0) {
          if (*(uint32_t *)(cast_addr_space.field_2._8_8_ + 0x18) != pSStack_20->vecsize) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&vector_type_1.member_name_cache._M_h._M_single_bucket,this,
                       (undefined1 *)((long)&cast_expr.field_2 + 8),0);
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                      (&local_638,(spirv_cross *)0x5ac375,(char (*) [2])local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x57fa85
                       ,(char (*) [2])&stack0xfffffffffffffe08,
                       (char **)&vector_type_1.member_name_cache._M_h._M_single_bucket,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x56c0d1
                       ,(char (*) [3])in_stack_fffffffffffff3a0);
            ::std::__cxx11::string::operator=((string *)local_380,(string *)&local_638);
            ::std::__cxx11::string::~string((string *)&local_638);
            ::std::__cxx11::string::~string
                      ((string *)&vector_type_1.member_name_cache._M_h._M_single_bucket);
          }
          if (local_bea == 0) {
            for (local_86c = 0; local_86c < pSStack_20->columns; local_86c = local_86c + 1) {
              CompilerGLSL::to_enclosed_expression_abi_cxx11_
                        (&local_890,&this->super_CompilerGLSL,type._4_4_,true);
              CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                        ((string *)&write_type_1.member_name_cache._M_h._M_single_bucket,
                         &this->super_CompilerGLSL,(uint32_t)type,true);
              CompilerGLSL::
              statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_380,&local_890,(char (*) [2])0x5978ea,&local_86c,
                         (char (*) [2])0x5977ef,(char (*) [4])0x5abcd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &write_type_1.member_name_cache._M_h._M_single_bucket,
                         (char (*) [2])0x5978ea,&local_86c,(char (*) [3])0x5963df);
              ::std::__cxx11::string::~string
                        ((string *)&write_type_1.member_name_cache._M_h._M_single_bucket);
              ::std::__cxx11::string::~string((string *)&local_890);
            }
          }
          else {
            pSVar6 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
            SPIRType::SPIRType((SPIRType *)local_7b8,pSVar6);
            vector_type_1.width = 1;
            for (rhs_row_1.field_2._12_4_ = 0; (uint)rhs_row_1.field_2._12_4_ < pSStack_20->columns;
                rhs_row_1.field_2._12_4_ = rhs_row_1.field_2._12_4_ + 1) {
              CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                        ((string *)local_800,&this->super_CompilerGLSL,(SPIRType *)local_7b8);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_7e0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_800,"(");
              ::std::__cxx11::string::~string((string *)local_800);
              for (unpacked_expr.field_2._12_4_ = 0;
                  (uint)unpacked_expr.field_2._12_4_ < vector_type_1.basetype;
                  unpacked_expr.field_2._12_4_ = unpacked_expr.field_2._12_4_ + 1) {
                CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                          ((string *)local_828,&this->super_CompilerGLSL,(uint32_t)type);
                join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                          (&local_848,(spirv_cross *)local_828,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x5978ea,(char (*) [2])((long)&unpacked_expr.field_2 + 0xc),(uint *)"][",
                           (char (*) [3])((long)&rhs_row_1.field_2 + 0xc),(uint *)0x5977ef,
                           (char (*) [2])in_stack_fffffffffffff3a0);
                ::std::__cxx11::string::operator+=((string *)local_7e0,(string *)&local_848);
                ::std::__cxx11::string::~string((string *)&local_848);
                if (unpacked_expr.field_2._12_4_ + Void < vector_type_1.basetype) {
                  ::std::__cxx11::string::operator+=((string *)local_7e0,", ");
                }
                ::std::__cxx11::string::~string((string *)local_828);
              }
              ::std::__cxx11::string::operator+=((string *)local_7e0,")");
              CompilerGLSL::to_enclosed_expression_abi_cxx11_
                        ((string *)local_868,&this->super_CompilerGLSL,type._4_4_,true);
              in_stack_fffffffffffff3a0 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e0;
              CompilerGLSL::
              statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_380,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_868,(char (*) [2])0x5978ea,
                         (uint *)(rhs_row_1.field_2._M_local_buf + 0xc),(char (*) [2])0x5977ef,
                         (char (*) [4])0x5abcd8,in_stack_fffffffffffff3a0,(char (*) [2])0x5abb6c);
              ::std::__cxx11::string::~string((string *)local_868);
              ::std::__cxx11::string::~string((string *)local_7e0);
            }
            SPIRType::~SPIRType((SPIRType *)local_7b8);
          }
        }
        else {
          rhs_e->need_transpose = false;
          if (*(uint32_t *)(cast_addr_space.field_2._8_8_ + 0x1c) != pSStack_20->columns) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (local_3c0,this,(undefined1 *)((long)&cast_expr.field_2 + 8),0);
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                      (&local_3a0,(spirv_cross *)0x5ac375,(char (*) [2])local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x57fa85
                       ,(char (*) [2])&stack0xfffffffffffffe08,(char **)local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x56c0d1
                       ,(char (*) [3])in_stack_fffffffffffff3a0);
            ::std::__cxx11::string::operator=((string *)local_380,(string *)&local_3a0);
            ::std::__cxx11::string::~string((string *)&local_3a0);
            ::std::__cxx11::string::~string(local_3c0);
          }
          if (local_bea == 0) {
            pSVar6 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
            SPIRType::SPIRType((SPIRType *)local_568,pSVar6);
            vector_type.basetype = vector_type.width;
            vector_type.width = 1;
            for (rhs_row.field_2._12_4_ = 0; (uint)rhs_row.field_2._12_4_ < pSStack_20->vecsize;
                rhs_row.field_2._12_4_ = rhs_row.field_2._12_4_ + 1) {
              CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                        ((string *)local_5b0,&this->super_CompilerGLSL,(SPIRType *)local_568);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_590,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5b0,"(");
              ::std::__cxx11::string::~string((string *)local_5b0);
              for (local_5b4 = Unknown; local_5b4 < vector_type.basetype;
                  local_5b4 = local_5b4 + Void) {
                CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                          (&local_5f8,&this->super_CompilerGLSL,(uint32_t)type,true);
                join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                          (&local_5d8,(spirv_cross *)&local_5f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x5978ea,(char (*) [2])&local_5b4,(uint *)"][",
                           (char (*) [3])((long)&rhs_row.field_2 + 0xc),(uint *)0x5977ef,
                           (char (*) [2])in_stack_fffffffffffff3a0);
                ::std::__cxx11::string::operator+=((string *)local_590,(string *)&local_5d8);
                ::std::__cxx11::string::~string((string *)&local_5d8);
                ::std::__cxx11::string::~string((string *)&local_5f8);
                if (local_5b4 + Void < vector_type.basetype) {
                  ::std::__cxx11::string::operator+=((string *)local_590,", ");
                }
              }
              ::std::__cxx11::string::operator+=((string *)local_590,")");
              CompilerGLSL::to_enclosed_expression_abi_cxx11_
                        (&local_618,&this->super_CompilerGLSL,type._4_4_,true);
              in_stack_fffffffffffff3a0 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590;
              CompilerGLSL::
              statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_380,&local_618,(char (*) [2])0x5978ea,
                         (uint *)(rhs_row.field_2._M_local_buf + 0xc),(char (*) [2])0x5977ef,
                         (char (*) [4])0x5abcd8,in_stack_fffffffffffff3a0,(char (*) [2])0x5abb6c);
              ::std::__cxx11::string::~string((string *)&local_618);
              ::std::__cxx11::string::~string((string *)local_590);
            }
            SPIRType::~SPIRType((SPIRType *)local_568);
          }
          else {
            for (local_3c4 = 0; local_3c4 < pSStack_20->vecsize; local_3c4 = local_3c4 + 1) {
              CompilerGLSL::to_enclosed_expression_abi_cxx11_
                        (&local_3e8,&this->super_CompilerGLSL,type._4_4_,true);
              CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                        ((string *)&vector_type.member_name_cache._M_h._M_single_bucket,
                         &this->super_CompilerGLSL,(uint32_t)type);
              CompilerGLSL::
              statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_380,&local_3e8,(char (*) [2])0x5978ea,&local_3c4,
                         (char (*) [2])0x5977ef,(char (*) [4])0x5abcd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vector_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x5978ea
                         ,&local_3c4,(char (*) [3])0x5963df);
              ::std::__cxx11::string::~string
                        ((string *)&vector_type.member_name_cache._M_h._M_single_bucket);
              ::std::__cxx11::string::~string((string *)&local_3e8);
            }
          }
          rhs_e->need_transpose = true;
        }
        if (local_bea != 0) {
          pSStack_38->need_transpose = true;
        }
        ::std::__cxx11::string::~string((string *)local_380);
        SPIRType::~SPIRType((SPIRType *)((long)&cast_expr.field_2 + 8));
      }
      else if ((local_39 & 1) == 0) {
        bVar2 = Compiler::is_matrix((Compiler *)this,(SPIRType *)cast_addr_space.field_2._8_8_);
        if ((((bVar2) ||
             (bVar2 = Compiler::is_array((Compiler *)this,(SPIRType *)cast_addr_space.field_2._8_8_)
             , bVar2)) && (*(uint *)(cast_addr_space.field_2._8_8_ + 0x18) < 5)) &&
           (pSStack_20->vecsize < *(uint *)(cast_addr_space.field_2._8_8_ + 0x18))) {
          bVar2 = false;
          if (pSStack_20->vecsize != 0) {
            bVar2 = pSStack_20->vecsize < 4;
          }
          if (!bVar2) {
            __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                          ,0x154e,
                          "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                         );
          }
          if (((lhs_e._6_1_ ^ 0xff) & 1) == 0) {
            __assert_fail("!lhs_packed_type",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                          ,0x1554,
                          "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                         );
          }
          CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                    ((string *)((long)&rhs.field_2 + 8),&this->super_CompilerGLSL,type._4_4_,true);
          CompilerGLSL::to_pointer_expression_abi_cxx11_
                    ((string *)local_af8,&this->super_CompilerGLSL,(uint32_t)type,true);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_b38,this,pSStack_20,0);
          CompilerGLSL::enclose_expression
                    ((string *)((long)&lhs_1.field_2 + 8),&this->super_CompilerGLSL,
                     (string *)((long)&rhs.field_2 + 8));
          join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                    (&local_b18,(spirv_cross *)0x5ac375,(char (*) [2])local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x57fa85,
                     (char (*) [2])local_b38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x56c0d1,
                     (char (*) [3])((long)&lhs_1.field_2 + 8),in_stack_fffffffffffff3a0);
          ::std::__cxx11::string::operator=
                    ((string *)(rhs.field_2._M_local_buf + 8),(string *)&local_b18);
          ::std::__cxx11::string::~string((string *)&local_b18);
          ::std::__cxx11::string::~string((string *)(lhs_1.field_2._M_local_buf + 8));
          ::std::__cxx11::string::~string(local_b38);
          pSVar6 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
          bVar2 = CompilerGLSL::optimize_read_modify_write
                            (&this->super_CompilerGLSL,pSVar6,(string *)((long)&rhs.field_2 + 8),
                             (string *)local_af8);
          if (!bVar2) {
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&rhs.field_2 + 8),(char (*) [4])0x5abcd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_af8,(char (*) [2])0x5abb6c);
          }
          ::std::__cxx11::string::~string((string *)local_af8);
          ::std::__cxx11::string::~string((string *)(rhs.field_2._M_local_buf + 8));
        }
        else {
          bVar2 = Compiler::is_matrix((Compiler *)this,pSStack_20);
          if (!bVar2) {
            CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                      ((string *)((long)&rhs_1.field_2 + 8),&this->super_CompilerGLSL,type._4_4_,
                       true);
            CompilerGLSL::to_pointer_expression_abi_cxx11_
                      ((string *)local_b98,&this->super_CompilerGLSL,(uint32_t)type,true);
            pSVar6 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
            bVar2 = CompilerGLSL::optimize_read_modify_write
                              (&this->super_CompilerGLSL,pSVar6,(string *)((long)&rhs_1.field_2 + 8)
                               ,(string *)local_b98);
            if (!bVar2) {
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&rhs_1.field_2 + 8),(char (*) [4])0x5abcd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b98,(char (*) [2])0x5abb6c);
            }
            ::std::__cxx11::string::~string((string *)local_b98);
            ::std::__cxx11::string::~string((string *)(rhs_1.field_2._M_local_buf + 8));
          }
        }
      }
      else {
        rhs_e->need_transpose = false;
        SPIRType::SPIRType((SPIRType *)local_a10,pSStack_20);
        write_type_1.basetype = Void;
        write_type_1.width = 1;
        for (lhs_expr_1.field_2._12_4_ = 0; (uint)lhs_expr_1.field_2._12_4_ < pSStack_20->vecsize;
            lhs_expr_1.field_2._12_4_ = lhs_expr_1.field_2._12_4_ + 1) {
          CompilerGLSL::to_enclosed_expression_abi_cxx11_
                    ((string *)&column_index_1,&this->super_CompilerGLSL,type._4_4_,true);
          end_column_index = ::std::__cxx11::string::find_last_of((char)&column_index_1,0x5b);
          end_dot_index = ::std::__cxx11::string::find_last_of((char)&column_index_1,0x5d);
          local_a50 = ::std::__cxx11::string::find_last_of((char)&column_index_1,0x2e);
          if ((local_a50 != 0xffffffffffffffff) && (end_dot_index < local_a50)) {
            ::std::__cxx11::string::resize((ulong)&column_index_1);
          }
          if (end_column_index != 0xffffffffffffffff) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_a70,this,local_a10,0);
            sVar1 = end_column_index;
            local_a91 = (spirv_cross)0x5b;
            local_a92 = 0x5d;
            join<char,unsigned_int&,char,char_const(&)[2]>
                      (&local_a90,&local_a91,lhs_expr_1.field_2._M_local_buf + 0xc,
                       (uint *)&local_a92,")",in_R9);
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ::std::__cxx11::string::insert((ulong)&column_index_1,(string *)sVar1);
            CompilerGLSL::to_extract_component_expression_abi_cxx11_
                      ((string *)((long)&lhs.field_2 + 8),&this->super_CompilerGLSL,(uint32_t)type,
                       lhs_expr_1.field_2._12_4_);
            in_R9 = (char (*) [2])0x5abb58;
            CompilerGLSL::
            statement<char_const(&)[3],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [3])0x59db21,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0,(char (*) [2])0x57fa85,&local_a70,(char (*) [4])0x5abb58,pbVar5,
                       (char (*) [4])0x5abcd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&lhs.field_2 + 8),(char (*) [2])0x5abb6c);
            ::std::__cxx11::string::~string((string *)(lhs.field_2._M_local_buf + 8));
            ::std::__cxx11::string::~string((string *)&local_a90);
            ::std::__cxx11::string::~string((string *)&local_a70);
          }
          ::std::__cxx11::string::~string((string *)&column_index_1);
        }
        rhs_e->need_transpose = true;
        SPIRType::~SPIRType((SPIRType *)local_a10);
      }
      Compiler::register_write((Compiler *)this,type._4_4_);
      ::std::__cxx11::string::~string((string *)local_1c0);
    }
    else {
      CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,type._4_4_,(uint32_t)type);
    }
  }
  else {
    CompilerGLSL::to_expression_abi_cxx11_(&local_68,&this->super_CompilerGLSL,type._4_4_,true);
    CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
              (&local_88,&this->super_CompilerGLSL,(uint32_t)type,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[5]>
              (&this->super_CompilerGLSL,&local_68,(char (*) [4])0x5abcd8,&local_88,
               (char (*) [5])0x5963dd);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_68);
    Compiler::register_write((Compiler *)this,type._4_4_);
  }
  return;
}

Assistant:

void CompilerMSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto &type = expression_type(rhs_expression);

	bool lhs_remapped_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID);
	bool lhs_packed_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypePacked);
	auto *lhs_e = maybe_get<SPIRExpression>(lhs_expression);
	auto *rhs_e = maybe_get<SPIRExpression>(rhs_expression);

	bool transpose = lhs_e && lhs_e->need_transpose;

	if (has_decoration(lhs_expression, DecorationBuiltIn) &&
	    BuiltIn(get_decoration(lhs_expression, DecorationBuiltIn)) == BuiltInSampleMask &&
	    is_array(type))
	{
		// Storing an array to SampleMask, have to remove the array-ness before storing.
		statement(to_expression(lhs_expression), " = ", to_enclosed_unpacked_expression(rhs_expression), "[0];");
		register_write(lhs_expression);
	}
	else if (!lhs_remapped_type && !lhs_packed_type)
	{
		// No physical type remapping, and no packed type, so can just emit a store directly.

		// We might not be dealing with remapped physical types or packed types,
		// but we might be doing a clean store to a row-major matrix.
		// In this case, we just flip transpose states, and emit the store, a transpose must be in the RHS expression, if any.
		if (is_matrix(type) && lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			if (rhs_e && rhs_e->need_transpose)
			{
				// Direct copy, but might need to unpack RHS.
				// Skip the transpose, as we will transpose when writing to LHS and transpose(transpose(T)) == T.
				rhs_e->need_transpose = false;
				statement(to_expression(lhs_expression), " = ", to_unpacked_row_major_matrix_expression(rhs_expression),
				          ";");
				rhs_e->need_transpose = true;
			}
			else
				statement(to_expression(lhs_expression), " = transpose(", to_unpacked_expression(rhs_expression), ");");

			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else if (lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_dereferenced_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement(lhs_expr.insert(column_index, join('[', c, ']')), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}
			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else
			CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else if (!lhs_remapped_type && !is_matrix(type) && !transpose)
	{
		// Even if the target type is packed, we can directly store to it. We cannot store to packed matrices directly,
		// since they are declared as array of vectors instead, and we need the fallback path below.
		CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else
	{
		// Special handling when storing to a remapped physical type.
		// This is mostly to deal with std140 padded matrices or vectors.

		TypeID physical_type_id = lhs_remapped_type ?
		                              ID(get_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID)) :
		                              type.self;

		auto &physical_type = get<SPIRType>(physical_type_id);

		string cast_addr_space = "thread";
		auto *p_var_lhs = maybe_get_backing_variable(lhs_expression);
		if (p_var_lhs)
			cast_addr_space = get_type_address_space(get<SPIRType>(p_var_lhs->basetype), lhs_expression);

		if (is_matrix(type))
		{
			const char *packed_pfx = lhs_packed_type ? "packed_" : "";

			// Packed matrices are stored as arrays of packed vectors, so we need
			// to assign the vectors one at a time.
			// For row-major matrices, we need to transpose the *right-hand* side,
			// not the left-hand side.

			// Lots of cases to cover here ...

			bool rhs_transpose = rhs_e && rhs_e->need_transpose;
			SPIRType write_type = type;
			string cast_expr;

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = false;

			if (transpose)
			{
				// We're dealing with transpose manually.
				lhs_e->need_transpose = false;
				write_type.vecsize = type.columns;
				write_type.columns = 1;

				if (physical_type.columns != type.columns)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					// If RHS is also transposed, we can just copy row by row.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_unpacked_row_major_matrix_expression(rhs_expression), "[", i, "];");
					}
				}
				else
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.vecsize = vector_type.columns;
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							rhs_row += join(to_enclosed_unpacked_expression(rhs_expression), "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}

				// We're dealing with transpose manually.
				lhs_e->need_transpose = true;
			}
			else
			{
				write_type.columns = 1;

				if (physical_type.vecsize != type.vecsize)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							// Need to explicitly unpack expression since we've mucked with transpose state.
							auto unpacked_expr = to_unpacked_row_major_matrix_expression(rhs_expression);
							rhs_row += join(unpacked_expr, "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}
				else
				{
					// Copy column-by-column.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_enclosed_unpacked_expression(rhs_expression), "[", i, "];");
					}
				}
			}

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = true;
		}
		else if (transpose)
		{
			lhs_e->need_transpose = false;

			SPIRType write_type = type;
			write_type.vecsize = 1;
			write_type.columns = 1;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_enclosed_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');

				// Get rid of any ".data" half8 handling here, we're casting to scalar anyway.
				auto end_column_index = lhs_expr.find_last_of(']');
				auto end_dot_index = lhs_expr.find_last_of('.');
				if (end_dot_index != string::npos && end_dot_index > end_column_index)
					lhs_expr.resize(end_dot_index);

				if (column_index != string::npos)
				{
					statement("((", cast_addr_space, " ", type_to_glsl(write_type), "*)&",
					          lhs_expr.insert(column_index, join('[', c, ']', ")")), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}

			lhs_e->need_transpose = true;
		}
		else if ((is_matrix(physical_type) || is_array(physical_type)) &&
		         physical_type.vecsize <= 4 &&
		         physical_type.vecsize > type.vecsize)
		{
			assert(type.vecsize >= 1 && type.vecsize <= 3);

			// If we have packed types, we cannot use swizzled stores.
			// We could technically unroll the store for each element if needed.
			// When remapping to a std140 physical type, we always get float4,
			// and the packed decoration should always be removed.
			assert(!lhs_packed_type);

			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);

			// Unpack the expression so we can store to it with a float or float2.
			// It's still an l-value, so it's fine. Most other unpacking of expressions turn them into r-values instead.
			lhs = join("(", cast_addr_space, " ", type_to_glsl(type), "&)", enclose_expression(lhs));
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		else if (!is_matrix(type))
		{
			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}

		register_write(lhs_expression);
	}
}